

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_striped_sse2_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  parasail_profile_t *profile;
  parasail_result_t *ppVar1;
  char *pcVar2;
  char *__format;
  
  if (s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar2 = "s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar2 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar2 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar2 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar2 = "matrix";
  }
  else {
    if (matrix->type != 0) {
LAB_00519368:
      profile = parasail_profile_create_sse_128_16(s1,s1Len,matrix);
      if (profile == (parasail_profile_t *)0x0) {
        return (parasail_result_t *)0x0;
      }
      ppVar1 = parasail_sw_striped_profile_sse2_128_16(profile,s2,s2Len,open,gap);
      parasail_profile_free(profile);
      return ppVar1;
    }
    if (s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar2 = "s1";
    }
    else {
      if (0 < s1Len) goto LAB_00519368;
      __format = "%s: %s must be > 0\n";
      pcVar2 = "s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_sw_striped_sse2_128_16",pcVar2);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_profile_t *profile = NULL;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
        PARASAIL_CHECK_GT0(s1Len);
    }

    /* initialize local variables */
    profile = parasail_profile_create_sse_128_16(s1, s1Len, matrix);
    if (!profile) return NULL;
    result = PNAME(profile, s2, s2Len, open, gap);

    parasail_profile_free(profile);

    return result;
}